

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_inflate.c
# Opt level: O3

REF_STATUS
ref_inflate_face(REF_GRID ref_grid,REF_DICT faceids,REF_DBL *origin,REF_DBL thickness,REF_DBL xshift
                )

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  REF_MPI pRVar7;
  REF_CELL pRVar8;
  REF_CELL pRVar9;
  REF_ADJ pRVar10;
  REF_DBL *pRVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  REF_STATUS RVar15;
  uint uVar16;
  REF_BOOL RVar17;
  void *pvVar18;
  void *__ptr;
  void *pvVar19;
  void *__s;
  REF_INT *pRVar20;
  REF_GLOB *vector;
  long lVar21;
  long lVar22;
  ulong uVar23;
  REF_ADJ_ITEM pRVar24;
  undefined8 uVar25;
  long lVar26;
  int iVar27;
  REF_INT cell;
  ulong uVar28;
  ulong uVar29;
  char *pcVar30;
  size_t sVar31;
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  int iVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  REF_INT new_node;
  REF_INT new_cell;
  REF_DBL y0;
  REF_INT tris [2];
  REF_DBL y1;
  REF_DBL temp;
  REF_INT nquad;
  REF_INT ntri;
  REF_INT nodes [27];
  REF_DBL min_dot;
  REF_GLOB global;
  REF_INT quads [2];
  REF_INT new_nodes [27];
  REF_INT ref_nodes [27];
  REF_INT local_294;
  REF_NODE local_290;
  REF_CELL local_288;
  REF_DICT local_280;
  int local_274;
  REF_MPI local_270;
  REF_DBL *local_268;
  REF_INT local_25c;
  undefined1 local_258 [24];
  void *local_240;
  void *local_238;
  REF_DBL local_230;
  double local_228;
  int local_220;
  int local_21c;
  REF_DBL local_218;
  undefined1 local_210 [16];
  double local_200;
  void *local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [16];
  REF_CELL local_1d0;
  double local_1c8;
  REF_DBL local_1c0;
  int local_1b8;
  int local_1b4;
  REF_GRID local_1b0;
  int local_1a8 [3];
  REF_INT local_19c;
  REF_CELL local_138;
  double local_130;
  REF_GLOB local_128;
  int local_120 [2];
  int local_118;
  int local_114;
  REF_INT local_110;
  REF_INT local_10c;
  REF_INT local_108;
  REF_INT local_104;
  REF_INT local_a8 [3];
  REF_INT local_9c;
  
  uVar16 = faceids->n;
  uVar29 = (ulong)uVar16;
  local_280 = faceids;
  local_268 = origin;
  if ((int)uVar16 < 0) {
    pcVar30 = "malloc face_normal of REF_DBL negative";
    uVar25 = 0x73;
    goto LAB_001897d3;
  }
  pRVar7 = ref_grid->mpi;
  local_290 = ref_grid->node;
  local_288 = ref_grid->cell[3];
  pRVar8 = ref_grid->cell[6];
  pRVar9 = ref_grid->cell[10];
  local_230 = xshift;
  local_1c0 = thickness;
  pvVar18 = malloc(uVar29 * 0x18);
  auVar45 = _DAT_00221120;
  if (pvVar18 == (void *)0x0) {
    pcVar30 = "malloc face_normal of REF_DBL NULL";
    uVar25 = 0x73;
    goto LAB_00189b2a;
  }
  local_270 = pRVar7;
  local_238 = pvVar18;
  local_1d0 = pRVar8;
  if (uVar29 == 0) {
    pvVar18 = malloc(0);
    sVar31 = 0;
    uVar28 = 0;
    if (pvVar18 == (void *)0x0) goto LAB_00189994;
  }
  else {
    lVar22 = (uVar29 * 3 & 0xffffffff) - 1;
    auVar33._8_4_ = (int)lVar22;
    auVar33._0_8_ = lVar22;
    auVar33._12_4_ = (int)((ulong)lVar22 >> 0x20);
    uVar28 = 0;
    auVar33 = auVar33 ^ _DAT_00221120;
    auVar40 = _DAT_00221110;
    do {
      bVar12 = auVar33._0_4_ < SUB164(auVar40 ^ auVar45,0);
      iVar27 = auVar33._4_4_;
      iVar46 = SUB164(auVar40 ^ auVar45,4);
      if ((bool)(~(iVar27 < iVar46 || iVar46 == iVar27 && bVar12) & 1)) {
        *(undefined8 *)((long)pvVar18 + uVar28 * 8) = 0xbff0000000000000;
      }
      if (iVar27 >= iVar46 && (iVar46 != iVar27 || !bVar12)) {
        *(undefined8 *)((long)pvVar18 + uVar28 * 8 + 8) = 0xbff0000000000000;
      }
      uVar28 = uVar28 + 2;
      lVar22 = auVar40._8_8_;
      auVar40._0_8_ = auVar40._0_8_ + 2;
      auVar40._8_8_ = lVar22 + 2;
    } while (((int)(uVar29 * 3) + 1U & 0xfffffffe) != uVar28);
    sVar31 = uVar29 * 8;
    pvVar18 = malloc(sVar31);
    auVar45 = _DAT_00221120;
    if (pvVar18 == (void *)0x0) {
LAB_00189994:
      pcVar30 = "malloc ymin of REF_DBL NULL";
      uVar25 = 0x77;
      goto LAB_00189b2a;
    }
    uVar28 = uVar29;
    if (uVar29 != 0) {
      lVar22 = uVar29 - 1;
      auVar34._8_4_ = (int)lVar22;
      auVar34._0_8_ = lVar22;
      auVar34._12_4_ = (int)((ulong)lVar22 >> 0x20);
      lVar22 = 0;
      auVar34 = auVar34 ^ _DAT_00221120;
      auVar41 = _DAT_00221110;
      do {
        bVar12 = auVar34._0_4_ < SUB164(auVar41 ^ auVar45,0);
        iVar27 = auVar34._4_4_;
        iVar46 = SUB164(auVar41 ^ auVar45,4);
        if ((bool)(~(iVar27 < iVar46 || iVar46 == iVar27 && bVar12) & 1)) {
          *(undefined8 *)((long)pvVar18 + lVar22) = 0x6974e718d7d7625a;
        }
        if (iVar27 >= iVar46 && (iVar46 != iVar27 || !bVar12)) {
          *(undefined8 *)((long)pvVar18 + lVar22 + 8) = 0x6974e718d7d7625a;
        }
        lVar26 = auVar41._8_8_;
        auVar41._0_8_ = auVar41._0_8_ + 2;
        auVar41._8_8_ = lVar26 + 2;
        lVar22 = lVar22 + 0x10;
      } while ((ulong)(uVar16 + 1 >> 1) << 4 != lVar22);
    }
  }
  local_138 = pRVar9;
  __ptr = malloc(sVar31);
  auVar45 = _DAT_00221120;
  if (__ptr == (void *)0x0) {
    pcVar30 = "malloc ymax of REF_DBL NULL";
    uVar25 = 0x78;
    goto LAB_00189b2a;
  }
  local_1b0 = ref_grid;
  if (uVar29 == 0) {
    pvVar19 = malloc(sVar31);
    if (pvVar19 == (void *)0x0) goto LAB_00189b09;
  }
  else {
    lVar22 = uVar28 - 1;
    auVar47._8_4_ = (int)lVar22;
    auVar47._0_8_ = lVar22;
    auVar47._12_4_ = (int)((ulong)lVar22 >> 0x20);
    uVar23 = 0;
    local_1e8 = auVar47 ^ _DAT_00221120;
    auVar35 = _DAT_00221110;
    do {
      bVar12 = local_1e8._0_4_ < SUB164(auVar35 ^ auVar45,0);
      iVar27 = SUB164(auVar35 ^ auVar45,4);
      iVar46 = local_1e8._4_4_;
      if ((bool)(~(iVar46 < iVar27 || iVar27 == iVar46 && bVar12) & 1)) {
        *(undefined8 *)((long)__ptr + uVar23 * 8) = 0xe974e718d7d7625a;
      }
      if (iVar46 >= iVar27 && (iVar27 != iVar46 || !bVar12)) {
        *(undefined8 *)((long)__ptr + uVar23 * 8 + 8) = 0xe974e718d7d7625a;
      }
      uVar23 = uVar23 + 2;
      lVar22 = auVar35._8_8_;
      auVar35._0_8_ = auVar35._0_8_ + 2;
      auVar35._8_8_ = lVar22 + 2;
    } while (((int)uVar28 + 1U & 0xfffffffe) != uVar23);
    pvVar19 = malloc(sVar31);
    auVar45 = _DAT_00221120;
    if (pvVar19 == (void *)0x0) {
LAB_00189b09:
      pcVar30 = "malloc orient of REF_DBL NULL";
      uVar25 = 0x79;
      goto LAB_00189b2a;
    }
    if (uVar29 != 0) {
      uVar29 = 0;
      auVar36 = _DAT_00221110;
      do {
        bVar12 = local_1e8._0_4_ < SUB164(auVar36 ^ auVar45,0);
        iVar27 = SUB164(auVar36 ^ auVar45,4);
        iVar46 = local_1e8._4_4_;
        if ((bool)(~(iVar46 < iVar27 || iVar27 == iVar46 && bVar12) & 1)) {
          *(undefined8 *)((long)pvVar19 + uVar29 * 8) = 0x3ff0000000000000;
        }
        if (iVar46 >= iVar27 && (iVar27 != iVar46 || !bVar12)) {
          *(undefined8 *)((long)pvVar19 + uVar29 * 8 + 8) = 0x3ff0000000000000;
        }
        uVar29 = uVar29 + 2;
        lVar22 = auVar36._8_8_;
        auVar36._0_8_ = auVar36._0_8_ + 2;
        auVar36._8_8_ = lVar22 + 2;
      } while (((int)uVar28 + 1U & 0xfffffffe) != uVar29);
    }
  }
  local_1e8._0_8_ = pvVar19;
  local_228 = 1e+200;
  local_200 = -1e+200;
  if (0 < local_288->max) {
    iVar27 = 0;
    do {
      RVar15 = ref_cell_nodes(local_288,iVar27,local_1a8);
      if ((RVar15 == 0) && (RVar17 = ref_dict_has_key(local_280,local_19c), RVar17 != 0)) {
        lVar22 = 0;
        do {
          uVar16 = ref_dict_location(local_280,local_19c,&local_294);
          if (uVar16 != 0) {
            pcVar30 = "key loc";
            uVar25 = 0x80;
            goto LAB_00189cb3;
          }
          dVar32 = local_290->real[(long)local_1a8[lVar22] * 0xf + 1] - local_268[1];
          lVar26 = (long)local_294;
          if (dVar32 < *(double *)((long)pvVar18 + lVar26 * 8)) {
            *(double *)((long)pvVar18 + lVar26 * 8) = dVar32;
          }
          pdVar1 = (double *)((long)__ptr + lVar26 * 8);
          if (*pdVar1 <= dVar32 && dVar32 != *pdVar1) {
            *(double *)((long)__ptr + lVar26 * 8) = dVar32;
          }
          if (dVar32 < local_228) {
            local_228 = dVar32;
          }
          if (local_200 < dVar32) {
            local_200 = dVar32;
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 != 3);
      }
      iVar27 = iVar27 + 1;
    } while (iVar27 < local_288->max);
  }
  pRVar7 = local_270;
  local_1c8 = local_228;
  uVar16 = ref_mpi_min(local_270,&local_1c8,&local_228,3);
  if (uVar16 != 0) {
    pcVar30 = "max thresh";
    uVar25 = 0x93;
    goto LAB_00189cb3;
  }
  uVar16 = ref_mpi_bcast(pRVar7,&local_228,1,3);
  if (uVar16 != 0) {
    pcVar30 = "bcast";
    uVar25 = 0x94;
    goto LAB_00189cb3;
  }
  local_1c8 = local_200;
  uVar16 = ref_mpi_max(pRVar7,&local_1c8,&local_200,3);
  if (uVar16 != 0) {
    pcVar30 = "max thresh";
    uVar25 = 0x96;
    goto LAB_00189cb3;
  }
  uVar16 = ref_mpi_bcast(pRVar7,&local_200,1,3);
  pRVar7 = local_270;
  if (uVar16 != 0) {
    pcVar30 = "bcast";
    uVar25 = 0x97;
    goto LAB_00189cb3;
  }
  local_294 = 0;
  uVar16 = local_280->n;
  if (0 < (int)uVar16) {
    do {
      pdVar1 = (double *)((long)pvVar18 + (long)local_294 * 8);
      local_1c8 = *pdVar1;
      uVar16 = ref_mpi_min(pRVar7,&local_1c8,pdVar1,3);
      if (uVar16 != 0) {
        pcVar30 = "max thresh";
        uVar25 = 0x9c;
        goto LAB_00189cb3;
      }
      uVar16 = ref_mpi_bcast(pRVar7,(void *)((long)pvVar18 + (long)local_294 * 8),1,3);
      if (uVar16 != 0) {
        pcVar30 = "bcast";
        uVar25 = 0x9d;
        goto LAB_00189cb3;
      }
      local_1c8 = *(double *)((long)__ptr + (long)local_294 * 8);
      uVar16 = ref_mpi_max(pRVar7,&local_1c8,(void *)((long)__ptr + (long)local_294 * 8),3);
      if (uVar16 != 0) {
        pcVar30 = "max thresh";
        uVar25 = 0x9f;
        goto LAB_00189cb3;
      }
      uVar16 = ref_mpi_bcast(pRVar7,(void *)((long)__ptr + (long)local_294 * 8),1,3);
      if (uVar16 != 0) {
        pcVar30 = "bcast";
        uVar25 = 0xa0;
        goto LAB_00189cb3;
      }
      lVar22 = (long)local_294;
      *(undefined8 *)(local_1e8._0_8_ + lVar22 * 8) =
           *(undefined8 *)
            (&DAT_0022dda0 +
            (ulong)(*(double *)((long)pvVar18 + lVar22 * 8) - local_228 <
                   local_200 - *(double *)((long)__ptr + lVar22 * 8)) * 8);
      local_294 = local_294 + 1;
      uVar16 = local_280->n;
    } while (local_294 < (int)uVar16);
  }
  if ((int)uVar16 < 0) {
    pcVar30 = "malloc tmin of REF_DBL negative";
    uVar25 = 0xa9;
    goto LAB_001897d3;
  }
  uVar29 = (ulong)uVar16;
  sVar31 = uVar29 * 8;
  pvVar19 = malloc(sVar31);
  auVar45 = _DAT_00221120;
  if (pvVar19 == (void *)0x0) {
    pcVar30 = "malloc tmin of REF_DBL NULL";
    uVar25 = 0xa9;
    goto LAB_00189b2a;
  }
  if (uVar16 == 0) {
    local_1f8 = malloc(sVar31);
    if (local_1f8 == (void *)0x0) goto LAB_0018a0cf;
  }
  else {
    lVar22 = uVar29 - 1;
    auVar48._8_4_ = (int)lVar22;
    auVar48._0_8_ = lVar22;
    auVar48._12_4_ = (int)((ulong)lVar22 >> 0x20);
    lVar22 = 0;
    local_258._0_16_ = auVar48 ^ _DAT_00221120;
    auVar37 = _DAT_00221110;
    do {
      bVar12 = local_258._0_4_ < SUB164(auVar37 ^ auVar45,0);
      iVar27 = SUB164(auVar37 ^ auVar45,4);
      iVar46 = local_258._4_4_;
      if ((bool)(~(iVar46 < iVar27 || iVar27 == iVar46 && bVar12) & 1)) {
        *(undefined8 *)((long)pvVar19 + lVar22) = 0x402921fb54442d11;
      }
      if (iVar46 >= iVar27 && (iVar27 != iVar46 || !bVar12)) {
        *(undefined8 *)((long)pvVar19 + lVar22 + 8) = 0x402921fb54442d11;
      }
      lVar26 = auVar37._8_8_;
      auVar37._0_8_ = auVar37._0_8_ + 2;
      auVar37._8_8_ = lVar26 + 2;
      lVar22 = lVar22 + 0x10;
    } while ((ulong)(uVar16 + 1 >> 1) << 4 != lVar22);
    local_1f8 = malloc(sVar31);
    auVar45 = _DAT_00221120;
    if (local_1f8 == (void *)0x0) {
LAB_0018a0cf:
      pcVar30 = "malloc tmax of REF_DBL NULL";
      uVar25 = 0xaa;
      goto LAB_00189b2a;
    }
    if (uVar16 != 0) {
      lVar22 = 0;
      auVar38 = _DAT_00221110;
      do {
        bVar12 = (int)local_258._0_4_ < SUB164(auVar38 ^ auVar45,0);
        iVar27 = SUB164(auVar38 ^ auVar45,4);
        if ((bool)(~((int)local_258._4_4_ < iVar27 || iVar27 == local_258._4_4_ && bVar12) & 1)) {
          *(undefined8 *)((long)local_1f8 + lVar22) = 0xc02921fb54442d11;
        }
        if ((int)local_258._4_4_ >= iVar27 && (iVar27 != local_258._4_4_ || !bVar12)) {
          *(undefined8 *)((long)local_1f8 + lVar22 + 8) = 0xc02921fb54442d11;
        }
        lVar26 = auVar38._8_8_;
        auVar38._0_8_ = auVar38._0_8_ + 2;
        auVar38._8_8_ = lVar26 + 2;
        lVar22 = lVar22 + 0x10;
      } while ((ulong)(uVar16 + 1 >> 1) << 4 != lVar22);
    }
  }
  sVar31 = uVar29 << 2;
  __s = malloc(sVar31);
  local_258._0_8_ = __s;
  if (__s == (void *)0x0) {
    pcVar30 = "malloc imin of REF_INT NULL";
    uVar25 = 0xab;
    goto LAB_00189b2a;
  }
  if (uVar16 == 0) {
    local_240 = malloc(sVar31);
    if (local_240 == (void *)0x0) goto LAB_0018a23c;
  }
  else {
    memset(__s,0xff,sVar31);
    local_240 = malloc(sVar31);
    if (local_240 == (void *)0x0) {
LAB_0018a23c:
      pcVar30 = "malloc imax of REF_INT NULL";
      uVar25 = 0xac;
      goto LAB_00189b2a;
    }
    memset(local_240,0xff,sVar31);
  }
  if (0 < local_288->max) {
    cell = 0;
    do {
      RVar15 = ref_cell_nodes(local_288,cell,local_1a8);
      if ((RVar15 == 0) && (RVar17 = ref_dict_has_key(local_280,local_19c), RVar17 != 0)) {
        lVar22 = 0;
        do {
          uVar16 = ref_dict_location(local_280,local_19c,&local_294);
          if (uVar16 != 0) {
            pcVar30 = "key loc";
            uVar25 = 0xb1;
            goto LAB_00189cb3;
          }
          iVar27 = local_1a8[lVar22];
          dVar32 = atan2(local_290->real[(long)iVar27 * 0xf + 2] - local_268[2],
                         (local_290->real[(long)iVar27 * 0xf + 1] - local_268[1]) *
                         *(double *)(local_1e8._0_8_ + (long)local_294 * 8));
          lVar26 = (long)local_294;
          if (dVar32 < *(double *)((long)pvVar19 + lVar26 * 8)) {
            *(double *)((long)pvVar19 + lVar26 * 8) = dVar32;
            *(int *)(local_258._0_8_ + lVar26 * 4) = iVar27;
          }
          pdVar1 = (double *)((long)local_1f8 + lVar26 * 8);
          if (*pdVar1 <= dVar32 && dVar32 != *pdVar1) {
            *(double *)((long)local_1f8 + lVar26 * 8) = dVar32;
            *(int *)((long)local_240 + lVar26 * 4) = iVar27;
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 != 3);
      }
      cell = cell + 1;
    } while (cell < local_288->max);
    uVar16 = local_280->n;
  }
  local_294 = 0;
  if (0 < (int)uVar16) {
    do {
      lVar22 = (long)local_294;
      iVar27 = *(int *)(local_258._0_8_ + lVar22 * 4);
      if (local_270->n < 2) {
        if (iVar27 == -1) {
          pcVar30 = "imin";
          uVar25 = 199;
LAB_0018a5f4:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                 ,uVar25,"ref_inflate_face",pcVar30);
          printf("empty %d: %d \n",(long)local_294,(ulong)(uint)local_280->key[local_294]);
          return 1;
        }
        if (*(int *)((long)local_240 + lVar22 * 4) == -1) {
          pcVar30 = "imax";
          uVar25 = 0xc9;
          goto LAB_0018a5f4;
        }
LAB_0018a2dc:
        lVar26 = (long)*(int *)((long)local_240 + lVar22 * 4);
        if (lVar26 != -1) {
          lVar21 = (long)(local_294 * 3);
          *(undefined8 *)((long)local_238 + lVar21 * 8) = 0;
          pRVar11 = local_290->real;
          dVar32 = pRVar11[lVar26 * 0xf + 2];
          dVar2 = *(double *)(local_1e8._0_8_ + lVar22 * 8);
          dVar3 = pRVar11[(long)iVar27 * 0xf + 2];
          *(double *)((long)local_238 + lVar21 * 8 + 8) = dVar32 - dVar3;
          auVar45._0_8_ = -dVar2 * (dVar32 - dVar3);
          auVar45._8_8_ = dVar2 * (pRVar11[lVar26 * 0xf + 1] - pRVar11[(long)iVar27 * 0xf + 1]);
          *(undefined1 (*) [16])((long)local_238 + lVar21 * 8 + 8) = auVar45;
          uVar16 = ref_math_normalize((REF_DBL *)((long)local_238 + lVar21 * 8));
          if (uVar16 != 0) {
            pcVar30 = "make face norm";
            uVar25 = 0xd6;
            goto LAB_00189cb3;
          }
          uVar16 = local_280->n;
        }
      }
      else if (iVar27 != -1) goto LAB_0018a2dc;
      local_294 = local_294 + 1;
    } while (local_294 < (int)uVar16);
  }
  free(local_240);
  free((void *)local_258._0_8_);
  free(local_1f8);
  free(pvVar19);
  free((void *)local_1e8._0_8_);
  free(__ptr);
  free(pvVar18);
  uVar4 = local_290->max;
  if ((long)(int)uVar4 < 0) {
    pcVar30 = "malloc o2n of REF_INT negative";
    uVar25 = 0xec;
    goto LAB_001897d3;
  }
  sVar31 = (long)(int)uVar4 * 4;
  pvVar18 = malloc(sVar31);
  if (pvVar18 == (void *)0x0) {
    pcVar30 = "malloc o2n of REF_INT NULL";
    uVar25 = 0xec;
LAB_00189b2a:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",
           uVar25,"ref_inflate_face",pcVar30);
    return 2;
  }
  if (uVar4 != 0) {
    memset(pvVar18,0xff,sVar31);
  }
  if (0 < local_288->max) {
    iVar27 = 0;
    do {
      RVar15 = ref_cell_nodes(local_288,iVar27,local_1a8);
      if ((RVar15 == 0) && (RVar17 = ref_dict_has_key(local_280,local_19c), RVar17 != 0)) {
        pRVar20 = local_290->part;
        lVar22 = 0;
        do {
          lVar26 = (long)local_1a8[lVar22];
          if ((local_290->ref_mpi->id == pRVar20[lVar26]) &&
             (*(int *)((long)pvVar18 + lVar26 * 4) == -1)) {
            uVar16 = ref_node_next_global(local_290,&local_128);
            if (uVar16 != 0) {
              pcVar30 = "global";
              uVar25 = 0xf4;
              goto LAB_00189cb3;
            }
            uVar16 = ref_node_add(local_290,local_128,&local_274);
            if (uVar16 != 0) {
              pcVar30 = "add node";
              uVar25 = 0xf5;
              goto LAB_00189cb3;
            }
            pRVar20 = local_290->part;
            pRVar20[local_274] = local_270->id;
            *(int *)((long)pvVar18 + lVar26 * 4) = local_274;
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 != 3);
      }
      iVar27 = iVar27 + 1;
    } while (iVar27 < local_288->max);
  }
  uVar16 = ref_node_shift_new_globals(local_290);
  if (uVar16 != 0) {
    pcVar30 = "shift glob";
    uVar25 = 0xff;
    goto LAB_00189cb3;
  }
  uVar16 = local_290->max;
  if ((long)(int)uVar16 < 0) {
    pcVar30 = "malloc o2g of REF_GLOB negative";
    uVar25 = 0x101;
    goto LAB_001897d3;
  }
  sVar31 = (long)(int)uVar16 * 8;
  vector = (REF_GLOB *)malloc(sVar31);
  if (vector == (REF_GLOB *)0x0) {
    pcVar30 = "malloc o2g of REF_GLOB NULL";
    uVar25 = 0x101;
    goto LAB_00189b2a;
  }
  if (uVar16 != 0) {
    memset(vector,0xff,sVar31);
  }
  if (uVar4 != 0) {
    uVar29 = 0;
    do {
      uVar5 = *(uint *)((long)pvVar18 + uVar29 * 4);
      if ((ulong)uVar5 != 0xffffffff) {
        lVar22 = -1;
        if ((uVar5 < uVar16) && (lVar22 = local_290->global[uVar5], lVar22 < 0)) {
          lVar22 = -1;
        }
        vector[uVar29] = lVar22;
      }
      uVar29 = uVar29 + 1;
    } while (uVar4 != uVar29);
  }
  uVar16 = ref_node_ghost_glob(local_290,vector,1);
  if (uVar16 != 0) {
    pcVar30 = "update ghosts";
    uVar25 = 0x109;
    goto LAB_00189cb3;
  }
  free(pvVar18);
  uVar4 = local_290->max;
  lVar22 = (long)(int)uVar4;
  if (lVar22 < 0) {
    pcVar30 = "malloc o2n of REF_INT negative";
    uVar25 = 0x10d;
    goto LAB_001897d3;
  }
  local_270 = (REF_MPI)malloc(lVar22 * 4);
  if (local_270 == (REF_MPI)0x0) {
    pcVar30 = "malloc o2n of REF_INT NULL";
    uVar25 = 0x10d;
    local_270 = (REF_MPI)0x0;
    goto LAB_00189b2a;
  }
  if (uVar4 == 0) {
LAB_0018aba8:
    auVar14._12_4_ = 0;
    auVar14._0_12_ = local_258._4_12_;
    local_258._0_16_ = auVar14 << 0x20;
  }
  else {
    memset(local_270,0xff,lVar22 * 4);
    uVar29 = 0;
    do {
      if (vector[uVar29] != -1) {
        uVar16 = ref_node_add(local_290,vector[uVar29],&local_274);
        if (uVar16 != 0) {
          pcVar30 = "add node";
          uVar25 = 0x112;
          goto LAB_00189cb3;
        }
        local_290->part[local_274] = local_290->part[uVar29];
        (&local_270->n)[uVar29] = local_274;
      }
      uVar29 = uVar29 + 1;
    } while (uVar4 != uVar29);
    lVar26 = 0;
    auVar13._12_4_ = 0;
    auVar13._0_12_ = local_258._4_12_;
    local_258._0_16_ = auVar13 << 0x20;
    do {
      if ((((lVar26 < local_290->max) && (-1 < local_290->global[lVar26])) &&
          (local_290->ref_mpi->id == local_290->part[lVar26])) && ((&local_270->n)[lVar26] != -1)) {
        local_218 = 0.0;
        local_210._8_8_ = local_290->real[lVar26 * 0xf + 2] - local_268[2];
        local_210._0_8_ = local_290->real[lVar26 * 0xf + 1] - local_268[1];
        local_274 = (&local_270->n)[lVar26];
        uVar16 = ref_math_normalize(&local_218);
        if (uVar16 != 0) {
          pcVar30 = "make norm";
          uVar25 = 0x120;
          goto LAB_00189cb3;
        }
        pRVar10 = local_288->ref_adj;
        if ((lVar26 < pRVar10->nnode) && (iVar27 = pRVar10->first[lVar26], iVar27 != -1)) {
          pRVar24 = pRVar10->item;
          do {
            uVar16 = ref_cell_nodes(local_288,pRVar24[iVar27].ref,local_a8);
            if (uVar16 != 0) {
              pcVar30 = "cell";
              uVar25 = 0x122;
              goto LAB_00189cb3;
            }
            RVar17 = ref_dict_has_key(local_280,local_9c);
            if (RVar17 != 0) {
              uVar16 = ref_dict_location(local_280,local_9c,&local_294);
              if (uVar16 != 0) {
                pcVar30 = "key loc";
                uVar25 = 0x124;
                goto LAB_00189cb3;
              }
              lVar21 = (long)local_294;
              dVar32 = *(double *)((long)local_238 + lVar21 * 0x18);
              if (dVar32 <= -0.1) {
                pcVar30 = "uninitialized face_normal";
                uVar25 = 0x126;
                goto LAB_001897d3;
              }
              local_1e8._0_8_ =
                   (double)local_210._8_8_ * *(double *)((long)local_238 + lVar21 * 0x18 + 0x10) +
                   dVar32 * local_218 +
                   *(double *)((long)local_238 + lVar21 * 0x18 + 8) * (double)local_210._0_8_;
              local_1f8 = (void *)-(double)local_1e8._0_8_;
              uStack_1f0 = 0x8000000000000000;
              local_1e8._8_8_ = 0;
              if ((-0.7 < (double)local_1e8._0_8_) || ((double)local_1e8._0_8_ < -1.01)) {
                printf("out-of-range dot %.15f at %f %f %f\n");
                local_258._0_4_ = 1;
              }
              auVar44._0_8_ = (double)local_1e8._0_8_ * -1e+20;
              auVar44._8_8_ = local_210._0_8_;
              auVar42._0_8_ = -auVar44._0_8_;
              auVar42._8_8_ = -(double)local_210._0_8_;
              auVar45 = maxpd(auVar44,auVar42);
              if (auVar45._0_8_ <= auVar45._8_8_) {
                pcVar30 = "normal[1] /= dot";
                uVar25 = 0x136;
LAB_0018b077:
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                       ,uVar25,"ref_inflate_face",pcVar30);
                printf("dot %e\n");
                pRVar11 = local_290->real;
                printf(" xyz %f %f %f\n",pRVar11[lVar26 * 0xf & 0xffffffff],
                       pRVar11[lVar26 * 0xf + 1],pRVar11[lVar26 * 0xf + 2]);
                printf(" norm %f %f %f\n",local_218,local_210._0_8_,local_210._8_8_);
                lVar22 = (long)local_294;
                printf("%d face norm %f %f %f\n",*(undefined8 *)((long)local_238 + lVar22 * 0x18),
                       *(undefined8 *)((long)local_238 + lVar22 * 0x18 + 8),
                       *(undefined8 *)((long)local_238 + lVar22 * 0x18 + 0x10));
                return 1;
              }
              dVar32 = (double)local_210._8_8_;
              if ((double)local_210._8_8_ <= -(double)local_210._8_8_) {
                dVar32 = -(double)local_210._8_8_;
              }
              if (auVar45._0_8_ <= dVar32) {
                pcVar30 = "normal[2] /= dot";
                uVar25 = 0x13f;
                goto LAB_0018b077;
              }
              auVar39._8_8_ = local_210._8_8_;
              auVar39._0_8_ = local_210._0_8_;
              auVar43._8_8_ = local_1f8;
              auVar43._0_8_ = local_1f8;
              local_210 = divpd(auVar39,auVar43);
            }
            pRVar24 = local_288->ref_adj->item;
            iVar27 = pRVar24[iVar27].next;
          } while (iVar27 != -1);
        }
        pRVar11 = local_290->real;
        lVar21 = (long)local_274;
        pRVar11[lVar21 * 0xf] = pRVar11[lVar26 * 0xf] + local_230;
        pRVar11[lVar21 * 0xf + 1] = (double)local_210._0_8_ * local_1c0 + pRVar11[lVar26 * 0xf + 1];
        pRVar11[lVar21 * 0xf + 2] = (double)local_210._8_8_ * local_1c0 + pRVar11[lVar26 * 0xf + 2];
      }
      lVar26 = lVar26 + 1;
    } while (lVar26 != lVar22);
    if (local_258._0_4_ == 0) goto LAB_0018aba8;
    puts("ERROR: new node normal");
  }
  uVar16 = ref_node_ghost_real(local_290);
  if (uVar16 == 0) {
    free(local_238);
    if (0 < local_288->max) {
      local_230 = 0.0;
      do {
        RVar15 = ref_cell_nodes(local_288,SUB84(local_230,0),local_1a8);
        if ((RVar15 == 0) && (RVar17 = ref_dict_has_key(local_280,local_19c), RVar17 != 0)) {
          local_1c0 = (REF_DBL)(long)local_230._0_4_;
          lVar22 = 0;
          do {
            lVar26 = (long)local_288->size_per * (long)local_1c0;
            iVar27 = local_288->c2n[local_288->e2n[lVar22 * 2] + lVar26];
            iVar46 = local_288->c2n[(long)(int)lVar26 + (long)local_288->e2n[lVar22 * 2 + 1]];
            local_268 = (REF_DBL *)(long)iVar46;
            iVar6 = local_290->ref_mpi->id;
            if ((iVar6 == local_290->part[iVar27]) || (iVar6 == local_290->part[(long)local_268])) {
              uVar16 = ref_cell_list_with2(local_288,iVar27,iVar46,2,&local_1b4,&local_220);
              if (uVar16 != 0) {
                pcVar30 = "bad tri count";
                uVar25 = 0x15b;
                goto LAB_00189cb3;
              }
              if (local_1b4 == 1) {
                uVar16 = ref_cell_list_with2(local_1d0,iVar27,iVar46,2,&local_1b8,local_120);
                if (uVar16 != 0) {
                  pcVar30 = "bad quad count";
                  uVar25 = 0x15e;
                  goto LAB_00189cb3;
                }
                if ((long)local_1b8 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                         ,0x15f,"ref_inflate_face","tri without quad",1,(long)local_1b8);
                  return 1;
                }
                local_108 = local_1d0->c2n[(long)local_120[0] * (long)local_1d0->size_per + 4];
                local_110 = (&local_270->n)[(long)local_268];
                local_10c = (&local_270->n)[iVar27];
                local_118 = iVar27;
                local_114 = iVar46;
                uVar16 = ref_cell_add(local_1d0,&local_118,&local_25c);
                if (uVar16 != 0) {
                  pcVar30 = "qua tri1";
                  uVar25 = 0x165;
                  goto LAB_00189cb3;
                }
              }
              else {
                RVar17 = ref_dict_has_key(local_280,
                                          local_288->c2n
                                          [(long)local_220 * (long)local_288->size_per + 3]);
                if ((RVar17 == 0) ||
                   (RVar17 = ref_dict_has_key(local_280,
                                              local_288->c2n
                                              [(long)local_21c * (long)local_288->size_per + 3]),
                   RVar17 != 0)) {
                  RVar17 = ref_dict_has_key(local_280,
                                            local_288->c2n
                                            [(long)local_220 * (long)local_288->size_per + 3]);
                  if ((RVar17 == 0) &&
                     (RVar17 = ref_dict_has_key(local_280,
                                                local_288->c2n
                                                [(long)local_21c * (long)local_288->size_per + 3]),
                     RVar17 != 0)) {
                    local_108 = local_288->c2n[(long)local_220 * (long)local_288->size_per + 3];
                    local_110 = (&local_270->n)[(long)local_268];
                    local_10c = (&local_270->n)[iVar27];
                    local_118 = iVar27;
                    local_114 = iVar46;
                    uVar16 = ref_cell_add(local_1d0,&local_118,&local_25c);
                    if (uVar16 != 0) {
                      pcVar30 = "qua tri1";
                      uVar25 = 0x179;
                      goto LAB_00189cb3;
                    }
                  }
                }
                else {
                  local_108 = local_288->c2n[(long)local_21c * (long)local_288->size_per + 3];
                  local_110 = (&local_270->n)[(long)local_268];
                  local_10c = (&local_270->n)[iVar27];
                  local_118 = iVar27;
                  local_114 = iVar46;
                  uVar16 = ref_cell_add(local_1d0,&local_118,&local_25c);
                  if (uVar16 != 0) {
                    pcVar30 = "qua tri1";
                    uVar25 = 0x16f;
                    goto LAB_00189cb3;
                  }
                }
              }
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 != 3);
        }
        uVar16 = SUB84(local_230,0) + 1;
        local_230 = (REF_DBL)(ulong)uVar16;
      } while ((int)uVar16 < local_288->max);
      if (0 < local_288->max) {
        iVar27 = 0;
        do {
          RVar15 = ref_cell_nodes(local_288,iVar27,local_1a8);
          if ((RVar15 == 0) && (RVar17 = ref_dict_has_key(local_280,local_19c), RVar17 != 0)) {
            local_118 = local_1a8[0];
            local_114 = local_1a8[2];
            local_110 = local_1a8[1];
            local_10c = (&local_270->n)[local_1a8[0]];
            local_108 = (&local_270->n)[local_1a8[2]];
            local_104 = (&local_270->n)[local_1a8[1]];
            uVar16 = ref_inflate_pri_min_dot(local_290,&local_118,&local_130);
            if (uVar16 != 0) {
              pcVar30 = "md";
              uVar25 = 0x18a;
              goto LAB_00189cb3;
            }
            if (local_130 <= 0.0) {
              pRVar11 = local_290->real;
              lVar22 = (long)local_1a8[0];
              printf("min_dot %f near %f %f %f\n",local_130,pRVar11[lVar22 * 0xf],
                     pRVar11[lVar22 * 0xf + 1],pRVar11[lVar22 * 0xf + 2]);
              local_258._0_4_ = 1;
            }
            uVar16 = ref_cell_add(local_138,&local_118,&local_25c);
            if (uVar16 != 0) {
              pcVar30 = "pri";
              uVar25 = 0x193;
              goto LAB_00189cb3;
            }
          }
          iVar27 = iVar27 + 1;
        } while (iVar27 < local_288->max);
        if (0 < local_288->max) {
          iVar27 = 0;
          do {
            RVar15 = ref_cell_nodes(local_288,iVar27,local_1a8);
            if ((RVar15 == 0) && (RVar17 = ref_dict_has_key(local_280,local_19c), RVar17 != 0)) {
              local_1a8[0] = (&local_270->n)[local_1a8[0]];
              local_1a8[1] = (&local_270->n)[local_1a8[1]];
              local_1a8[2] = (&local_270->n)[local_1a8[2]];
              uVar16 = ref_cell_replace_whole(local_288,iVar27,local_1a8);
              if (uVar16 != 0) {
                pcVar30 = "repl";
                uVar25 = 0x19c;
                goto LAB_00189cb3;
              }
            }
            iVar27 = iVar27 + 1;
          } while (iVar27 < local_288->max);
        }
      }
    }
    free(vector);
    free(local_270);
    uVar16 = ref_gather_tec_movie_frame(local_1b0,"layer");
    if (uVar16 == 0) {
      if (local_258._0_4_ == 0) {
        return 0;
      }
      puts("ERROR: inflated grid invalid, writing ref_inflate_problem.tec");
      uVar16 = ref_export_tec_surf(local_1b0,"ref_inflate_problem.tec");
      if (uVar16 == 0) {
        pcVar30 = "problem detected, examine ref_inflate_problem.tec";
        uVar25 = 0x1a8;
LAB_001897d3:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",
               uVar25,"ref_inflate_face",pcVar30);
        return 1;
      }
      pcVar30 = "tec";
      uVar25 = 0x1a7;
    }
    else {
      pcVar30 = "movie frame";
      uVar25 = 0x1a3;
    }
  }
  else {
    pcVar30 = "set new ghost node xyz";
    uVar25 = 0x14f;
  }
LAB_00189cb3:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",uVar25,
         "ref_inflate_face",(ulong)uVar16,pcVar30);
  return uVar16;
}

Assistant:

REF_FCN REF_STATUS ref_inflate_face(REF_GRID ref_grid, REF_DICT faceids,
                                    REF_DBL *origin, REF_DBL thickness,
                                    REF_DBL xshift) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL tri = ref_grid_tri(ref_grid);
  REF_CELL qua = ref_grid_qua(ref_grid);
  REF_CELL pri = ref_grid_pri(ref_grid);
  REF_INT cell, tri_side, node0, node1;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT ntri, tris[2], nquad, quads[2];
  REF_INT tri_node;
  REF_INT *o2n, o2n_max;
  REF_GLOB *o2g;
  REF_GLOB global;
  REF_INT new_node, node;
  REF_INT new_cell;
  REF_DBL min_dot;

  REF_DBL normal[3], dot;
  REF_INT ref_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, ref;

  REF_DBL *ymin, *ymax, dy, y0, y1, temp;
  REF_DBL *orient;
  REF_DBL *tmin, *tmax;
  REF_INT *imin, *imax;
  REF_DBL *face_normal;
  REF_INT i;
  REF_DBL theta;

  REF_BOOL problem_detected = REF_FALSE;

  REF_BOOL debug = REF_FALSE;
  REF_BOOL verbose = REF_FALSE;

  ref_malloc_init(face_normal, 3 * ref_dict_n(faceids), REF_DBL, -1.0);

  /* determine each faceids normal, only needed if my part has a tri */

  ref_malloc_init(ymin, ref_dict_n(faceids), REF_DBL, REF_DBL_MAX);
  ref_malloc_init(ymax, ref_dict_n(faceids), REF_DBL, -REF_DBL_MAX);
  ref_malloc_init(orient, ref_dict_n(faceids), REF_DBL, 1);

  y0 = REF_DBL_MAX;
  y1 = -REF_DBL_MAX;
  each_ref_cell_valid_cell_with_nodes(tri, cell, nodes) {
    if (ref_dict_has_key(faceids, nodes[3])) {
      for (tri_node = 0; tri_node < 3; tri_node++) {
        RSS(ref_dict_location(faceids, nodes[3], &i), "key loc");
        node = nodes[tri_node];
        dy = ref_node_xyz(ref_node, 1, node) - origin[1];
        if (ymin[i] > dy) {
          ymin[i] = dy;
        }
        if (ymax[i] < dy) {
          ymax[i] = dy;
        }
        if (y0 > dy) {
          y0 = dy;
        }
        if (y1 < dy) {
          y1 = dy;
        }
      }
    }
  }
  temp = y0;
  RSS(ref_mpi_min(ref_mpi, &temp, &y0, REF_DBL_TYPE), "max thresh");
  RSS(ref_mpi_bcast(ref_mpi, &y0, 1, REF_DBL_TYPE), "bcast");
  temp = y1;
  RSS(ref_mpi_max(ref_mpi, &temp, &y1, REF_DBL_TYPE), "max thresh");
  RSS(ref_mpi_bcast(ref_mpi, &y1, 1, REF_DBL_TYPE), "bcast");

  if (verbose) printf("y %f %f\n", y0, y1);
  each_ref_dict_key_index(faceids, i) {
    temp = ymin[i];
    RSS(ref_mpi_min(ref_mpi, &temp, &(ymin[i]), REF_DBL_TYPE), "max thresh");
    RSS(ref_mpi_bcast(ref_mpi, &(ymin[i]), 1, REF_DBL_TYPE), "bcast");
    temp = ymax[i];
    RSS(ref_mpi_max(ref_mpi, &temp, &(ymax[i]), REF_DBL_TYPE), "max thresh");
    RSS(ref_mpi_bcast(ref_mpi, &(ymax[i]), 1, REF_DBL_TYPE), "bcast");
    if (y1 - ymax[i] > ymin[i] - y0) {
      orient[i] = -1.0;
    } else {
      orient[i] = 1.0;
    }
    if (verbose) printf("%d z %f %f o %f\n", i, ymin[i], ymax[i], orient[i]);
  }

  ref_malloc_init(tmin, ref_dict_n(faceids), REF_DBL, 4.0 * ref_math_pi);
  ref_malloc_init(tmax, ref_dict_n(faceids), REF_DBL, -4.0 * ref_math_pi);
  ref_malloc_init(imin, ref_dict_n(faceids), REF_INT, REF_EMPTY);
  ref_malloc_init(imax, ref_dict_n(faceids), REF_INT, REF_EMPTY);

  each_ref_cell_valid_cell_with_nodes(tri, cell, nodes) {
    if (ref_dict_has_key(faceids, nodes[3]))
      for (tri_node = 0; tri_node < 3; tri_node++) {
        RSS(ref_dict_location(faceids, nodes[3], &i), "key loc");
        node = nodes[tri_node];
        theta =
            atan2((ref_node_xyz(ref_node, 2, node) - origin[2]),
                  orient[i] * (ref_node_xyz(ref_node, 1, node) - origin[1]));

        if (tmin[i] > theta) {
          tmin[i] = theta;
          imin[i] = node;
        }
        if (tmax[i] < theta) {
          tmax[i] = theta;
          imax[i] = node;
        }
      }
  }

  if (debug) ref_dict_inspect(faceids);

  each_ref_dict_key_index(faceids, i) {
    if (!ref_mpi_para(ref_mpi)) {
      RUB(REF_EMPTY, imin[i], "imin",
          { printf("empty %d: %d \n", i, ref_dict_key(faceids, i)); });
      RUB(REF_EMPTY, imax[i], "imax",
          { printf("empty %d: %d \n", i, ref_dict_key(faceids, i)); });
    }
    if (REF_EMPTY != imin[i] && REF_EMPTY != imax[i]) {
      face_normal[0 + 3 * i] = 0.0;
      face_normal[1 + 3 * i] = (ref_node_xyz(ref_node, 2, imax[i]) -
                                ref_node_xyz(ref_node, 2, imin[i]));
      face_normal[2 + 3 * i] = -(ref_node_xyz(ref_node, 1, imax[i]) -
                                 ref_node_xyz(ref_node, 1, imin[i]));
      face_normal[1 + 3 * i] *= -orient[i];
      face_normal[2 + 3 * i] *= -orient[i];
      if (debug)
        printf("n=(%f,%f,%f)\n", face_normal[0 + 3 * i], face_normal[1 + 3 * i],
               face_normal[2 + 3 * i]);
      RSS(ref_math_normalize(&(face_normal[3 * i])), "make face norm");
      if (verbose && ref_mpi_once(ref_mpi))
        printf(
            "f=%5d n=(%7.4f,%7.4f,%7.4f) t=(%7.4f,%7.4f) angle %7.4f"
            " or %4.1f\n",
            ref_dict_key(faceids, i), face_normal[0 + 3 * i],
            face_normal[1 + 3 * i], face_normal[2 + 3 * i], tmin[i], tmax[i],
            ABS(tmin[i] - tmax[i]), orient[i]);
    }
  }

  ref_free(imax);
  ref_free(imin);
  ref_free(tmax);
  ref_free(tmin);

  ref_free(orient);

  ref_free(ymax);
  ref_free(ymin);

  o2n_max = ref_node_max(ref_node);
  ref_malloc_init(o2n, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  /* build list of node globals */
  each_ref_cell_valid_cell_with_nodes(tri, cell, nodes) {
    if (ref_dict_has_key(faceids, nodes[3])) {
      for (tri_node = 0; tri_node < 3; tri_node++) {
        node = nodes[tri_node];
        if (ref_node_owned(ref_node, node) && REF_EMPTY == o2n[node]) {
          RSS(ref_node_next_global(ref_node, &global), "global");
          RSS(ref_node_add(ref_node, global, &new_node), "add node");
          /* redundant */
          ref_node_part(ref_node, new_node) = ref_mpi_rank(ref_mpi);
          o2n[node] = new_node;
        }
      }
    }
  }

  /* sync globals */
  RSS(ref_node_shift_new_globals(ref_node), "shift glob");

  ref_malloc_init(o2g, ref_node_max(ref_node), REF_GLOB, REF_EMPTY);

  /* fill ghost node globals */
  for (node = 0; node < o2n_max; node++) {
    if (REF_EMPTY != o2n[node]) {
      o2g[node] = ref_node_global(ref_node, o2n[node]);
    }
  }
  RSS(ref_node_ghost_glob(ref_node, o2g, 1), "update ghosts");

  ref_free(o2n);
  o2n_max = ref_node_max(ref_node);
  ref_malloc_init(o2n, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  for (node = 0; node < o2n_max; node++) {
    if (REF_EMPTY != o2g[node]) {
      /* returns node if already added */
      RSS(ref_node_add(ref_node, o2g[node], &new_node), "add node");
      ref_node_part(ref_node, new_node) = ref_node_part(ref_node, node);
      o2n[node] = new_node;
    }
  }

  /* create offsets */
  for (node = 0; node < o2n_max; node++) {
    if (ref_node_valid(ref_node, node)) {
      if (ref_node_owned(ref_node, node) && REF_EMPTY != o2n[node]) {
        new_node = o2n[node];
        normal[0] = 0.0;
        normal[1] = ref_node_xyz(ref_node, 1, node) - origin[1];
        normal[2] = ref_node_xyz(ref_node, 2, node) - origin[2];
        RSS(ref_math_normalize(normal), "make norm");
        each_ref_cell_having_node(tri, node, item, ref) {
          RSS(ref_cell_nodes(tri, ref, ref_nodes), "cell");
          if (!ref_dict_has_key(faceids, ref_nodes[3])) continue;
          RSS(ref_dict_location(faceids, ref_nodes[3], &i), "key loc");
          dot = -ref_math_dot(normal, &(face_normal[3 * i]));
          RAS(face_normal[0 + 3 * i] > -0.1, "uninitialized face_normal");
          if (dot < 0.70 || dot > 1.01) {
            printf("out-of-range dot %.15f at %f %f %f\n", dot,
                   ref_node_xyz(ref_node, 0, node),
                   ref_node_xyz(ref_node, 1, node),
                   ref_node_xyz(ref_node, 2, node));
            problem_detected = REF_TRUE;
          }
          RAB(ref_math_divisible(normal[1], dot), "normal[1] /= dot", {
            printf("dot %e\n", dot);
            printf(" xyz %f %f %f\n", ref_node_xyz(ref_node, 0, node),
                   ref_node_xyz(ref_node, 1, node),
                   ref_node_xyz(ref_node, 2, node));
            printf(" norm %f %f %f\n", normal[0], normal[1], normal[2]);
            printf("%d face norm %f %f %f\n", i, face_normal[0 + 3 * i],
                   face_normal[1 + 3 * i], face_normal[2 + 3 * i]);
          });
          RAB(ref_math_divisible(normal[2], dot), "normal[2] /= dot", {
            printf("dot %e\n", dot);
            printf(" xyz %f %f %f\n", ref_node_xyz(ref_node, 0, node),
                   ref_node_xyz(ref_node, 1, node),
                   ref_node_xyz(ref_node, 2, node));
            printf(" norm %f %f %f\n", normal[0], normal[1], normal[2]);
            printf("%d face norm %f %f %f\n", i, face_normal[0 + 3 * i],
                   face_normal[1 + 3 * i], face_normal[2 + 3 * i]);
          });
          normal[1] /= dot;
          normal[2] /= dot;
        }
        ref_node_xyz(ref_node, 0, new_node) =
            xshift + ref_node_xyz(ref_node, 0, node);
        ref_node_xyz(ref_node, 1, new_node) =
            thickness * normal[1] + ref_node_xyz(ref_node, 1, node);
        ref_node_xyz(ref_node, 2, new_node) =
            thickness * normal[2] + ref_node_xyz(ref_node, 2, node);
      }
    }
  }

  if (problem_detected) printf("ERROR: new node normal\n");

  RSS(ref_node_ghost_real(ref_node), "set new ghost node xyz");

  ref_free(face_normal);

  each_ref_cell_valid_cell_with_nodes(tri, cell, nodes) {
    if (ref_dict_has_key(faceids, nodes[3])) {
      for (tri_side = 0; tri_side < 3; tri_side++) {
        node0 = ref_cell_e2n(tri, 0, tri_side, cell);
        node1 = ref_cell_e2n(tri, 1, tri_side, cell);
        if (ref_node_owned(ref_node, node0) ||
            ref_node_owned(ref_node, node1)) {
          RSS(ref_cell_list_with2(tri, node0, node1, 2, &ntri, tris),
              "bad tri count");
          if (1 == ntri) {
            RSS(ref_cell_list_with2(qua, node0, node1, 2, &nquad, quads),
                "bad quad count");
            REIS(1, nquad, "tri without quad");
            new_nodes[4] = ref_cell_c2n(qua, 4, quads[0]);
            new_nodes[0] = node0;
            new_nodes[1] = node1;
            new_nodes[2] = o2n[node1];
            new_nodes[3] = o2n[node0];
            RSS(ref_cell_add(qua, new_nodes, &new_cell), "qua tri1");
            continue;
          }
          if (ref_dict_has_key(faceids, ref_cell_c2n(tri, 3, tris[0])) &&
              !ref_dict_has_key(faceids, ref_cell_c2n(tri, 3, tris[1]))) {
            new_nodes[4] = ref_cell_c2n(tri, 3, tris[1]);
            new_nodes[0] = node0;
            new_nodes[1] = node1;
            new_nodes[2] = o2n[node1];
            new_nodes[3] = o2n[node0];
            RSS(ref_cell_add(qua, new_nodes, &new_cell), "qua tri1");
            continue;
          }
          if (!ref_dict_has_key(faceids, ref_cell_c2n(tri, 3, tris[0])) &&
              ref_dict_has_key(faceids, ref_cell_c2n(tri, 3, tris[1]))) {
            new_nodes[4] = ref_cell_c2n(tri, 3, tris[0]);
            new_nodes[0] = node0;
            new_nodes[1] = node1;
            new_nodes[2] = o2n[node1];
            new_nodes[3] = o2n[node0];
            RSS(ref_cell_add(qua, new_nodes, &new_cell), "qua tri1");
            continue;
          }
        }
      }
    }
  }

  each_ref_cell_valid_cell_with_nodes(tri, cell, nodes) {
    if (ref_dict_has_key(faceids, nodes[3])) {
      new_nodes[0] = nodes[0];
      new_nodes[1] = nodes[2];
      new_nodes[2] = nodes[1];
      new_nodes[3] = o2n[nodes[0]];
      new_nodes[4] = o2n[nodes[2]];
      new_nodes[5] = o2n[nodes[1]];

      RSS(ref_inflate_pri_min_dot(ref_node, new_nodes, &min_dot), "md");
      if (min_dot <= 0.0) {
        printf("min_dot %f near %f %f %f\n", min_dot,
               ref_node_xyz(ref_node, 0, nodes[0]),
               ref_node_xyz(ref_node, 1, nodes[0]),
               ref_node_xyz(ref_node, 2, nodes[0]));
        problem_detected = REF_TRUE;
      }

      RSS(ref_cell_add(pri, new_nodes, &new_cell), "pri");
    }
  }

  each_ref_cell_valid_cell_with_nodes(tri, cell, nodes) {
    if (ref_dict_has_key(faceids, nodes[3])) {
      nodes[0] = o2n[nodes[0]];
      nodes[1] = o2n[nodes[1]];
      nodes[2] = o2n[nodes[2]];
      RSS(ref_cell_replace_whole(tri, cell, nodes), "repl");
    }
  }

  ref_free(o2g);
  ref_free(o2n);

  ref_gather_blocking_frame(ref_grid, "layer");

  if (problem_detected) {
    printf("ERROR: inflated grid invalid, writing ref_inflate_problem.tec\n");
    RSS(ref_export_tec_surf(ref_grid, "ref_inflate_problem.tec"), "tec");
    THROW("problem detected, examine ref_inflate_problem.tec");
  }

  return REF_SUCCESS;
}